

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

Intp_Man_t * Intp_ManAlloc(void)

{
  Intp_Man_t *__s;
  lit *plVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  
  __s = (Intp_Man_t *)malloc(0x98);
  memset(__s,0,0x98);
  __s->nResLitsAlloc = 0x10000;
  plVar1 = (lit *)malloc(0x40000);
  __s->pResLits = plVar1;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 1000;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  pVVar2->pArray = ppvVar3;
  __s->vAntClas = pVVar2;
  __s->nAntStart = 0;
  __s->fProofVerif = 1;
  __s->fProofWrite = 0;
  return __s;
}

Assistant:

Intp_Man_t * Intp_ManAlloc()
{
    Intp_Man_t * p;
    // allocate the manager
    p = (Intp_Man_t *)ABC_ALLOC( char, sizeof(Intp_Man_t) );
    memset( p, 0, sizeof(Intp_Man_t) );
    // verification
    p->nResLitsAlloc = (1<<16);
    p->pResLits = ABC_ALLOC( lit, p->nResLitsAlloc );
    // proof recording
//    p->vAnties = Vec_IntAlloc( 1000 );
//    p->vBreaks = Vec_IntAlloc( 1000 );
    p->vAntClas = Vec_PtrAlloc( 1000 );
    p->nAntStart = 0;
    // parameters
    p->fProofWrite = 0;
    p->fProofVerif = 1;
    return p;    
}